

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfBufferInline.h
# Opt level: O0

void sbfBuffer_destroy(sbfBuffer buffer)

{
  int iVar1;
  int *in_RDI;
  
  iVar1 = sbfRefCount_decrement((sbfRefCount *)(in_RDI + 0xc));
  if (iVar1 != 0) {
    if (*(long *)(in_RDI + 6) != 0) {
      (**(code **)(in_RDI + 6))(in_RDI,*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 10));
    }
    if (*in_RDI == 0) {
      sbfPool_put(buffer);
    }
    else {
      free(in_RDI);
    }
  }
  return;
}

Assistant:

static SBF_INLINE void
sbfBuffer_destroy (sbfBuffer buffer)
{
    if (!sbfRefCount_decrement (&buffer->mRefCount))
        return;

    if (buffer->mDestroyCb != NULL)
    {
        buffer->mDestroyCb (buffer,
                            buffer->mDestroyData,
                            buffer->mDestroyClosure);
    }

    if (buffer->mAllocated)
#ifdef WIN32
        LocalFree (buffer);
#else
        free (buffer);
#endif
    else
        sbfPool_put (buffer);
}